

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall State::init(State *this,EVP_PKEY_CTX *ctx)

{
  pointer pBVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  std::vector<Ball,_std::allocator<Ball>_>::resize(&this->balls,(long)(int)ctx);
  uVar4 = 0;
  uVar3 = (ulong)ctx & 0xffffffff;
  if ((int)ctx < 1) {
    uVar3 = uVar4;
  }
  iVar2 = extraout_EAX;
  for (; uVar3 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    pBVar1 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar5 = frand();
    fVar5 = fVar5 * 0.05 + 0.02;
    *(float *)((long)&pBVar1->r + uVar4) = fVar5;
    *(float *)((long)&pBVar1->m + uVar4) = fVar5 * fVar5 * fVar5;
    fVar5 = frand();
    *(float *)((long)&pBVar1->x + uVar4) = fVar5 + fVar5 + -1.0;
    fVar5 = frand();
    *(float *)((long)&pBVar1->y + uVar4) = fVar5 + fVar5 + -1.0;
    fVar5 = frand();
    *(float *)((long)&pBVar1->z + uVar4) = fVar5 + fVar5 + -1.0;
    fVar5 = frand();
    *(float *)((long)&pBVar1->vx + uVar4) = fVar5 + fVar5 + -1.0;
    fVar5 = frand();
    *(float *)((long)&pBVar1->vy + uVar4) = fVar5 + fVar5 + -1.0;
    fVar5 = frand();
    *(float *)((long)&pBVar1->vz + uVar4) = fVar5 + fVar5 + -1.0;
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void init(int nBalls) {
        balls.resize(nBalls);
        for (int i = 0; i < nBalls; ++i) {
            auto & ball = balls[i];
            ball.r = 0.05f*frand() + 0.02f;
            ball.m = ball.r*ball.r*ball.r;

            ball.x = 2.0f*frand() - 1.0f;
            ball.y = 2.0f*frand() - 1.0f;
            ball.z = 2.0f*frand() - 1.0f;

            ball.vx = 2.0f*frand() - 1.0f;
            ball.vy = 2.0f*frand() - 1.0f;
            ball.vz = 2.0f*frand() - 1.0f;
        }
    }